

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O0

int Test_N_VGetVectorID(N_Vector X,N_Vector_ID ID,int myid)

{
  int iVar1;
  uint uVar2;
  uint in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  int local_4;
  
  iVar1 = N_VGetVectorID(in_RDI);
  if (iVar1 == in_ESI) {
    if (in_EDX == 0) {
      printf("PASSED test -- N_VGetVectorID \n");
    }
    local_4 = 0;
  }
  else {
    printf(">>> FAILED test -- N_VGetVectorID, Proc %d \n",(ulong)in_EDX);
    uVar2 = N_VGetVectorID(in_RDI);
    printf("    Unrecognized vector type %d \n \n",(ulong)uVar2);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int Test_N_VGetVectorID(N_Vector X, N_Vector_ID ID, int myid)
{
  if (N_VGetVectorID(X) != ID)
  {
    printf(">>> FAILED test -- N_VGetVectorID, Proc %d \n", myid);
    printf("    Unrecognized vector type %d \n \n", N_VGetVectorID(X));
    return (1);
  }
  else if (myid == 0) { printf("PASSED test -- N_VGetVectorID \n"); }
  return (0);
}